

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_message_field.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::csharp::MessageOneofFieldGenerator::GenerateMembers
          (MessageOneofFieldGenerator *this,Printer *printer)

{
  WritePropertyDocComment
            (printer,(this->super_MessageFieldGenerator).super_FieldGeneratorBase.descriptor_);
  FieldGeneratorBase::AddPublicMemberAttributes((FieldGeneratorBase *)this,printer);
  io::Printer::Print(printer,&(this->super_MessageFieldGenerator).super_FieldGeneratorBase.
                              variables_,
                     "$access_level$ $type_name$ $property_name$ {\n  get { return $has_property_check$ ? ($type_name$) $oneof_name$_ : null; }\n  set {\n    $oneof_name$_ = value;\n    $oneof_name$Case_ = value == null ? $oneof_property_name$OneofCase.None : $oneof_property_name$OneofCase.$property_name$;\n  }\n}\n"
                    );
  return;
}

Assistant:

void MessageOneofFieldGenerator::GenerateMembers(io::Printer* printer) {
  WritePropertyDocComment(printer, descriptor_);
  AddPublicMemberAttributes(printer);
  printer->Print(
    variables_,
    "$access_level$ $type_name$ $property_name$ {\n"
    "  get { return $has_property_check$ ? ($type_name$) $oneof_name$_ : null; }\n"
    "  set {\n"
    "    $oneof_name$_ = value;\n"
    "    $oneof_name$Case_ = value == null ? $oneof_property_name$OneofCase.None : $oneof_property_name$OneofCase.$property_name$;\n"
    "  }\n"
    "}\n");
}